

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reaction.cpp
# Opt level: O0

double __thiscall BindPolymerase::CalculatePropensity(BindPolymerase *this)

{
  double dVar1;
  int iVar2;
  int iVar3;
  SpeciesTracker *this_00;
  string *reactant;
  double dVar4;
  double prop_diff;
  double new_prop;
  SpeciesTracker *tracker;
  BindPolymerase *this_local;
  
  this_00 = SpeciesTracker::Instance();
  dVar1 = (this->super_Bind).rate_constant_;
  reactant = MobileElement::name_abi_cxx11_(&(this->pol_template_).super_MobileElement);
  iVar2 = SpeciesTracker::species(this_00,reactant);
  iVar3 = SpeciesTracker::species(this_00,&(this->super_Bind).promoter_name_);
  dVar4 = dVar1 * (double)iVar2 * (double)iVar3;
  dVar1 = (this->super_Bind).super_Reaction.old_prop_;
  (this->super_Bind).super_Reaction.old_prop_ = dVar4;
  return dVar4 - dVar1;
}

Assistant:

double BindPolymerase::CalculatePropensity() {
  auto &tracker = SpeciesTracker::Instance();
  double new_prop = rate_constant_ * tracker.species(pol_template_.name()) *
                    tracker.species(promoter_name_);
  double prop_diff = new_prop - old_prop_;
  old_prop_ = new_prop;
  return prop_diff;
}